

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strisdigit_s.c
# Opt level: O3

_Bool strisdigit_s(char *dest,rsize_t dmax)

{
  long lVar1;
  rsize_t rVar2;
  char cVar3;
  errno_t error;
  char *msg;
  long in_FS_OFFSET;
  _Bool _Var4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (dest == (char *)0x0) {
    msg = "strisdigit_s: dest is null";
    error = 400;
  }
  else if (dmax == 0) {
    msg = "strisdigit_s: dmax is 0";
    error = 0x191;
  }
  else {
    if (dmax < 0x10000001) {
      cVar3 = *dest;
      if (cVar3 == '\0') {
        _Var4 = false;
      }
      else {
        rVar2 = 1;
        do {
          _Var4 = (byte)(cVar3 - 0x30U) < 10;
          if ((!_Var4) || (dmax == rVar2)) break;
          cVar3 = dest[rVar2];
          rVar2 = rVar2 + 1;
        } while (cVar3 != '\0');
      }
      goto LAB_00105753;
    }
    msg = "strisdigit_s: dmax exceeds max";
    error = 0x193;
  }
  _Var4 = false;
  invoke_safe_str_constraint_handler(msg,(void *)0x0,error);
LAB_00105753:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return _Var4;
}

Assistant:

bool
strisdigit_s (const char *dest, rsize_t dmax)
{
    if (!dest) {
        invoke_safe_str_constraint_handler("strisdigit_s: dest is null",
                   NULL, ESNULLP);
        return (false);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strisdigit_s: dmax is 0",
                   NULL, ESZEROL);
        return (false);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strisdigit_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return (false);
    }

    if (*dest == '\0') {
        return (false);
    }

    while (dmax && *dest) {

        if ((*dest < '0') || (*dest > '9')) {
            return (false);
        }
        dest++;
        dmax--;
    }

    return (true);
}